

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O0

bool __thiscall
draco::PlyReader::ParseElementDataAscii(PlyReader *this,DecoderBuffer *buffer,int element_index)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  PlyProperty *this_01;
  int in_EDX;
  vector<draco::PlyElement,_std::allocator<draco::PlyElement>_> *in_RDI;
  int32_t val_1;
  float val;
  int v;
  int32_t num_entries;
  PlyPropertyWriter<double> prop_writer;
  PlyProperty *prop;
  int i;
  int entry;
  PlyElement *element;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  DataType in_stack_ffffffffffffff50;
  DataType in_stack_ffffffffffffff54;
  DecoderBuffer *in_stack_ffffffffffffff58;
  int local_8c;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  PlyPropertyWriter<double> *in_stack_ffffffffffffffa0;
  float *in_stack_ffffffffffffffb0;
  DecoderBuffer *in_stack_ffffffffffffffb8;
  int local_30;
  int local_2c;
  byte local_1;
  
  this_00 = std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::operator[]
                      (in_RDI,(long)in_EDX);
  for (local_2c = 0; iVar2 = PlyElement::num_entries(this_00), local_2c < iVar2;
      local_2c = local_2c + 1) {
    for (local_30 = 0; iVar2 = PlyElement::num_properties((PlyElement *)0x13f00f), local_30 < iVar2;
        local_30 = local_30 + 1) {
      this_01 = PlyElement::property
                          ((PlyElement *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           CONCAT13(in_stack_ffffffffffffff4f,
                                    CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)));
      PlyPropertyWriter<double>::PlyPropertyWriter
                (in_stack_ffffffffffffffa0,
                 (PlyProperty *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      in_stack_ffffffffffffff9c = 1;
      bVar1 = PlyProperty::is_list(this_01);
      if (bVar1) {
        parser::SkipWhitespace
                  ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        bVar1 = parser::ParseSignedInt
                          (in_stack_ffffffffffffff58,
                           (int32_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
        ;
        if (bVar1) {
          in_stack_ffffffffffffff58 = (DecoderBuffer *)&this_01->list_data_;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this_01->data_);
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (value_type_conflict4 *)
                     CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,
                                       CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                                      )));
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (value_type_conflict4 *)
                     CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,
                                       CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                                      )));
          goto LAB_0013f13e;
        }
        local_1 = 0;
        bVar1 = true;
      }
      else {
LAB_0013f13e:
        for (local_8c = 0; local_8c < in_stack_ffffffffffffff9c; local_8c = local_8c + 1) {
          parser::SkipWhitespace
                    ((DecoderBuffer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
          ;
          in_stack_ffffffffffffff54 = PlyProperty::data_type(this_01);
          if ((in_stack_ffffffffffffff54 == DT_FLOAT32) ||
             (in_stack_ffffffffffffff50 = PlyProperty::data_type(this_01),
             in_stack_ffffffffffffff50 == DT_FLOAT64)) {
            in_stack_ffffffffffffff4f =
                 parser::ParseFloat(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
            if (!(bool)in_stack_ffffffffffffff4f) {
              local_1 = 0;
              bVar1 = true;
              goto LAB_0013f249;
            }
            PlyPropertyWriter<double>::PushBackValue
                      ((PlyPropertyWriter<double> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (double)CONCAT17(in_stack_ffffffffffffff4f,
                                        CONCAT16(in_stack_ffffffffffffff4e,
                                                 CONCAT24(in_stack_ffffffffffffff4c,
                                                          in_stack_ffffffffffffff48))));
          }
          else {
            in_stack_ffffffffffffff4e =
                 parser::ParseSignedInt
                           (in_stack_ffffffffffffff58,
                            (int32_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                           );
            if (!(bool)in_stack_ffffffffffffff4e) {
              local_1 = 0;
              bVar1 = true;
              goto LAB_0013f249;
            }
            PlyPropertyWriter<double>::PushBackValue
                      ((PlyPropertyWriter<double> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (double)CONCAT17(in_stack_ffffffffffffff4f,
                                        CONCAT16(in_stack_ffffffffffffff4e,
                                                 CONCAT24(in_stack_ffffffffffffff4c,
                                                          in_stack_ffffffffffffff48))));
          }
        }
        bVar1 = false;
      }
LAB_0013f249:
      PlyPropertyWriter<double>::~PlyPropertyWriter((PlyPropertyWriter<double> *)0x13f253);
      if (bVar1) goto LAB_0013f297;
    }
  }
  local_1 = 1;
LAB_0013f297:
  return (bool)(local_1 & 1);
}

Assistant:

bool PlyReader::ParseElementDataAscii(DecoderBuffer *buffer,
                                      int element_index) {
  PlyElement &element = elements_[element_index];
  for (int entry = 0; entry < element.num_entries(); ++entry) {
    for (int i = 0; i < element.num_properties(); ++i) {
      PlyProperty &prop = element.property(i);
      PlyPropertyWriter<double> prop_writer(&prop);
      int32_t num_entries = 1;
      if (prop.is_list()) {
        parser::SkipWhitespace(buffer);
        // Parse the number of entries for the list element.
        if (!parser::ParseSignedInt(buffer, &num_entries)) {
          return false;
        }

        // Store offset to the main data entry.
        prop.list_data_.push_back(prop.data_.size() /
                                  prop.data_type_num_bytes_);
        // Store the number of entries.
        prop.list_data_.push_back(num_entries);
      }
      // Read and store the actual property data.
      for (int v = 0; v < num_entries; ++v) {
        parser::SkipWhitespace(buffer);
        if (prop.data_type() == DT_FLOAT32 || prop.data_type() == DT_FLOAT64) {
          float val;
          if (!parser::ParseFloat(buffer, &val)) {
            return false;
          }
          prop_writer.PushBackValue(val);
        } else {
          int32_t val;
          if (!parser::ParseSignedInt(buffer, &val)) {
            return false;
          }
          prop_writer.PushBackValue(val);
        }
      }
    }
  }
  return true;
}